

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableModel::itemChanged(QTableModel *this,QTableWidgetItem *item,QList<int> *roles)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  Data *local_20;
  
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  if (item != (QTableWidgetItem *)0x0) {
    if (item->d->headerItem == true) {
      lVar2 = (this->verticalHeaderItems).d.size;
      if (lVar2 != 0) {
        iVar3 = -1;
        lVar5 = 0;
        do {
          if (lVar2 << 3 == lVar5) goto LAB_0059253d;
          iVar3 = iVar3 + 1;
          plVar1 = (long *)((long)(this->verticalHeaderItems).d.ptr + lVar5);
          lVar5 = lVar5 + 8;
        } while ((QTableWidgetItem *)*plVar1 != item);
        if (-1 < iVar3) {
          if (*(Data **)(in_FS_OFFSET + 0x28) != local_20) goto LAB_005925af;
          iVar4 = 2;
          goto LAB_00592585;
        }
      }
LAB_0059253d:
      lVar2 = (this->horizontalHeaderItems).d.size;
      if (lVar2 != 0) {
        iVar3 = -1;
        lVar5 = 0;
        do {
          if (lVar2 << 3 == lVar5) goto LAB_00592595;
          iVar3 = iVar3 + 1;
          plVar1 = (long *)((long)(this->horizontalHeaderItems).d.ptr + lVar5);
          lVar5 = lVar5 + 8;
        } while ((QTableWidgetItem *)*plVar1 != item);
        if (-1 < iVar3) {
          if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
            iVar4 = 1;
LAB_00592585:
            QAbstractItemModel::headerDataChanged((Orientation)this,iVar4,iVar3);
            return;
          }
          goto LAB_005925af;
        }
      }
    }
    else {
      local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      index((QTableModel *)local_38,(char *)this,(int)item);
      if (((-1 < (int)local_38._0_4_) && (-1 < (long)local_38._0_8_)) &&
         ((QTableWidgetItem *)local_28.ptr != (QTableWidgetItem *)0x0)) {
        QAbstractItemModel::dataChanged
                  ((QModelIndex *)this,(QModelIndex *)local_38,(QList_conflict *)local_38);
      }
    }
  }
LAB_00592595:
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_005925af:
  __stack_chk_fail();
}

Assistant:

void QTableModel::itemChanged(QTableWidgetItem *item, const QList<int> &roles)
{
    if (!item)
        return;
    if (item->d->headerItem) {
        int row = verticalHeaderItems.indexOf(item);
        if (row >= 0) {
            emit headerDataChanged(Qt::Vertical, row, row);
        } else {
            int column = horizontalHeaderItems.indexOf(item);
            if (column >= 0)
                emit headerDataChanged(Qt::Horizontal, column, column);
        }
    } else {
        QModelIndex idx = index(item);
        if (idx.isValid())
            emit dataChanged(idx, idx, roles);
    }
}